

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soap_ctrlpt.c
# Opt level: O0

int get_host_and_path(char *ctrl_url,memptr *host,memptr *path,uri_type *url)

{
  int iVar1;
  size_t max;
  uri_type *url_local;
  memptr *path_local;
  memptr *host_local;
  char *ctrl_url_local;
  
  max = strlen(ctrl_url);
  iVar1 = parse_uri(ctrl_url,max,url);
  if (iVar1 == 1) {
    host->buf = (url->hostport).text.buff;
    host->length = (url->hostport).text.size;
    path->buf = (url->pathquery).buff;
    path->length = (url->pathquery).size;
    ctrl_url_local._4_4_ = 0;
  }
  else {
    ctrl_url_local._4_4_ = -1;
  }
  return ctrl_url_local._4_4_;
}

Assistant:

static UPNP_INLINE int get_host_and_path(
	char *ctrl_url, const memptr *host, const memptr *path, uri_type *url)
{
	if (parse_uri(ctrl_url, strlen(ctrl_url), url) != HTTP_SUCCESS) {
		return -1;
	}
	/* This is done to ensure that the buffer is kept const */
	((memptr *)host)->buf = (char *)url->hostport.text.buff;
	((memptr *)host)->length = url->hostport.text.size;

	((memptr *)path)->buf = (char *)url->pathquery.buff;
	((memptr *)path)->length = url->pathquery.size;

	return 0;
}